

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void VP8LHistogramSetClear(VP8LHistogramSet *set)

{
  int cache_bits;
  uint size;
  size_t __n;
  ulong uVar1;
  ulong uVar2;
  
  cache_bits = (*set->histograms)->palette_code_bits_;
  size = set->max_size;
  __n = HistogramSetTotalSize(size,cache_bits);
  uVar2 = 0;
  memset(set,0,__n);
  set->histograms = (VP8LHistogram **)(set + 1);
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set,cache_bits);
  uVar1 = (ulong)size;
  if ((int)size < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    set->histograms[uVar2]->palette_code_bits_ = cache_bits;
  }
  return;
}

Assistant:

void VP8LHistogramSetClear(VP8LHistogramSet* const set) {
  int i;
  const int cache_bits = set->histograms[0]->palette_code_bits_;
  const int size = set->max_size;
  const size_t total_size = HistogramSetTotalSize(size, cache_bits);
  uint8_t* memory = (uint8_t*)set;

  memset(memory, 0, total_size);
  memory += sizeof(*set);
  set->histograms = (VP8LHistogram**)memory;
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set, cache_bits);
  for (i = 0; i < size; ++i) {
    set->histograms[i]->palette_code_bits_ = cache_bits;
  }
}